

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O2

void shuff_decompress(uint32_t *out_u32,size_t to_decode,uint8_t *in_u8,size_t cSrcSize)

{
  ulong *puVar1;
  uint64_t uVar2;
  uint64_t *A;
  uint64_t uVar3;
  uint64_t *puVar4;
  uint64_t max_cw_length;
  uint64_t uVar5;
  uint64_t *puVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int64_t *p;
  ulong uVar11;
  bool bVar12;
  bit_io_t bio;
  uint64_t cw_lens [64];
  
  bio.bytes_written = 0;
  bio.buff_btg = 0x40;
  bio.in_u64 = (uint64_t *)in_u8;
  A = (uint64_t *)shuff_allocate(0x40000000);
  uVar3 = SHUFF_INPUT_ULONG(&bio,0x1b);
  puVar4 = (uint64_t *)shuff_allocate(uVar3 * 8 + 1);
  max_cw_length = SHUFF_INPUT_ULONG(&bio,6);
  for (lVar8 = 0; lVar8 <= (int)max_cw_length; lVar8 = lVar8 + 1) {
    cw_lens[lVar8] = 0;
  }
  for (puVar6 = puVar4; puVar6 < puVar4 + uVar3; puVar6 = puVar6 + 1) {
    uVar5 = SHUFF_INPUT_UNARY_CODE(&bio);
    cw_lens[max_cw_length - uVar5] = cw_lens[max_cw_length - uVar5] + 1;
    *puVar6 = max_cw_length - uVar5;
  }
  uVar11 = 0xffffffffffffffff;
  do {
    lVar8 = uVar11 + 1;
    uVar11 = uVar11 + 1;
  } while (cw_lens[lVar8] == 0);
  shuff_build_canonical_arrays(cw_lens,max_cw_length);
  shuff_interp_decode(&bio,A,uVar3);
  for (uVar9 = 0; (~((long)max_cw_length >> 0x3f) & max_cw_length) != uVar9; uVar9 = uVar9 + 1) {
    cw_lens[uVar9 + 1] = cw_lens[uVar9 + 1] + cw_lens[uVar9];
  }
  for (puVar6 = puVar4 + (uVar3 - 1); puVar4 <= puVar6; puVar6 = puVar6 + -1) {
    uVar5 = *puVar6;
    uVar2 = cw_lens[uVar5 - 1];
    *puVar6 = uVar2;
    cw_lens[uVar5 - 1] = uVar2 + 1;
  }
  puVar4[uVar3] = 1;
  uVar9 = 0;
  while (uVar9 < uVar3) {
    uVar5 = A[uVar9];
    uVar10 = uVar9;
    while (uVar2 = puVar4[uVar10], -1 < (long)uVar2) {
      puVar4[uVar10] = 0xffffffffffffffff;
      uVar10 = (ulong)(int)uVar2;
      uVar2 = A[uVar10];
      A[uVar10] = uVar5;
      uVar5 = uVar2;
    }
    uVar9 = uVar9 - 1;
    do {
      lVar8 = uVar9 + 1;
      uVar9 = uVar9 + 1;
    } while (puVar4[lVar8] == 0xffffffffffffffff);
  }
  free(puVar4);
  shuff_build_lut(max_cw_length);
  uVar9 = 8;
  if (8 < uVar11) {
    uVar9 = uVar11;
  }
  uVar11 = 0x40;
  uVar10 = 0;
  while (bVar12 = to_decode != 0, to_decode = to_decode - 1, bVar12) {
    uVar3 = SHUFF_INPUT_ULONG(&bio,uVar11);
    uVar7 = uVar3 | uVar10;
    puVar4 = shuff_lut[uVar7 >> 0x38];
    puVar6 = (uint64_t *)(uVar9 * 8 + 0x1b9750);
    if (puVar4 == (uint64_t *)0x0) {
      do {
        puVar4 = puVar6 + 1;
        puVar1 = puVar6 + 1;
        puVar6 = puVar4;
      } while (uVar7 < *puVar1);
    }
    uVar11 = ((long)(puVar4 + -0x372ec) >> 3) + 1;
    uVar10 = uVar7 << (uVar11 & 0x3f);
    *out_u32 = (int)A[((uVar7 >> ((ulong)(byte)~(byte)((long)(puVar4 + -0x372ec) >> 3) & 0x3f)) -
                      puVar4[-0x40]) + puVar4[0x40]] - 1;
    out_u32 = out_u32 + 1;
  }
  free(A);
  return;
}

Assistant:

void shuff_decompress(
    uint32_t* out_u32, size_t to_decode, const uint8_t* in_u8, size_t cSrcSize)
{
    bit_io_t bio;
    SHUFF_START_INPUT(&bio, in_u8);
    uint64_t* mapping
        = (uint64_t*)shuff_allocate(sizeof(uint64_t) * SHUFF_MAX_SYMBOL);
    uint64_t cw_lens[SHUFF_L + 1];

    uint64_t n = SHUFF_INPUT_ULONG(&bio, SHUFF_LOG2_MAX_SYMBOL);
    int64_t* lens = (int64_t*)shuff_allocate(sizeof(int64_t) * n + 1);

    uint64_t max_cw_len = SHUFF_INPUT_ULONG(&bio, SHUFF_LOG2_L);

    for (int i = 0; i <= (int)max_cw_len; i++)
        cw_lens[i] = 0;
    for (int64_t* p = lens; p < lens + n; p++) {
        *p = max_cw_len - SHUFF_INPUT_UNARY_CODE(&bio);
        cw_lens[*p]++;
    }

    uint64_t min_cw_len = 0;
    for (min_cw_len = 0; cw_lens[min_cw_len] == 0; min_cw_len++)
        ;

    shuff_build_canonical_arrays(cw_lens, max_cw_len);

    shuff_interp_decode(&bio, mapping, n);

    for (int i = 1; i <= (int64_t)max_cw_len; i++)
        cw_lens[i] += cw_lens[i - 1];

    for (int64_t* p = lens + n - 1; p >= lens; p--)
        *p = cw_lens[*p - 1]++;

    uint64_t t, from, S;
    int64_t start = 0;
    lens[n] = 1; // sentinel
    while (start < n) {
        from = start;
        S = mapping[start];

        while (lens[from] >= 0) {
            int i = lens[from];
            lens[from] = -1;
            t = mapping[i];
            mapping[i] = S;
            S = t;
            from = i;
        }

        while (lens[start] == -1)
            start++; // find next start (if any)
    }
    free(lens);

    shuff_build_lut(max_cw_len);

    uint64_t code = 0;
    uint64_t bits_needed = sizeof(uint64_t) << 3;
    uint64_t currcode;
    uint64_t currlen = sizeof(uint64_t) << 3;
    uint64_t* lj;
    uint64_t* start_linear_search
        = shuff_lj_base + SHUFF_MAX(SHUFF_LUT_BITS, min_cw_len) - 1;

    while (to_decode != 0) {
        code |= SHUFF_INPUT_ULONG(&bio, bits_needed);

        lj = shuff_lut[code >> ((sizeof(uint64_t) << 3) - SHUFF_LUT_BITS)];
        if (lj == NULL)
            for (lj = start_linear_search; code < *lj; lj++)
                ;
        currlen = lj - shuff_lj_base + 1;

        // calculate symbol number
        currcode = code >> ((sizeof(uint64_t) << 3) - currlen);
        currcode -= shuff_min_code[currlen - 1];
        currcode += shuff_offset[currlen - 1];

        // subtract the one added in encoding
        *out_u32++ = mapping[currcode] - 1; // we add 1 to everything we encode

        code <<= currlen;
        bits_needed = currlen;
        to_decode--;
    }

    free(mapping);
}